

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDocumentHandler.cpp
# Opt level: O0

void __thiscall
ResourceCopierTask::ResourceCopierTask
          (ResourceCopierTask *this,PDFFormXObject *inFormXObject,PDFDocumentHandler *inCopier,
          PDFObject *inObjectToCopy)

{
  PDFObject *inObjectToCopy_local;
  PDFDocumentHandler *inCopier_local;
  PDFFormXObject *inFormXObject_local;
  ResourceCopierTask *this_local;
  
  IResourceWritingTask::IResourceWritingTask(&this->super_IResourceWritingTask);
  (this->super_IResourceWritingTask)._vptr_IResourceWritingTask =
       (_func_int **)&PTR__ResourceCopierTask_0054ee30;
  std::__cxx11::string::string((string *)&this->mResourceName);
  this->mCopier = inCopier;
  this->mObjectToCopy = inObjectToCopy;
  RefCountObject::AddRef(&this->mObjectToCopy->super_RefCountObject);
  this->mFormXObject = inFormXObject;
  return;
}

Assistant:

ResourceCopierTask(PDFFormXObject* inFormXObject,PDFDocumentHandler* inCopier,PDFObject* inObjectToCopy)
    {
        mCopier = inCopier;
        mObjectToCopy = inObjectToCopy;
        mObjectToCopy->AddRef();
        mFormXObject = inFormXObject;
    }